

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O1

int __thiscall n_pca::NPca::detector(NPca *this,u_char *image_data)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  Index size;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  MatrixXd detector_zero_matrix;
  MatrixXd detector_matrix;
  MatrixXd detector_data_matrix;
  DenseStorage<double,__1,__1,__1,_0> local_88;
  DenseStorage<double,__1,__1,__1,_0> local_70;
  double *local_58;
  long local_50;
  long local_48;
  undefined1 *local_40;
  MatrixXd *local_38;
  
  uVar10 = (long)this->n_config_->image_width_ * (long)this->n_config_->image_height_;
  local_88.m_data = (double *)0x1;
  local_88.m_cols = 0;
  local_88.m_rows = uVar10;
  if ((int)uVar10 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_70,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_88);
  if ((int)uVar10 != 0) {
    uVar4 = 0;
    pdVar3 = local_70.m_data;
    do {
      *pdVar3 = (double)image_data[uVar4];
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + local_70.m_rows;
    } while ((uVar10 & 0xffffffff) != uVar4);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_88,&local_70);
  pdVar3 = (this->train_mean_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  lVar6 = (this->train_mean_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  if (-1 < lVar6 || pdVar3 == (double *)0x0) {
    lVar8 = (this->train_mean_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    if (lVar8 < 1) {
LAB_00106415:
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                   );
    }
    if (-1 < local_88.m_cols || local_88.m_data == (double *)0x0) {
      if (local_88.m_rows < 1) goto LAB_00106415;
      if (local_88.m_cols != lVar6) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
                     );
      }
      pdVar5 = local_88.m_data;
      lVar6 = local_88.m_cols;
      if (0 < local_88.m_cols) {
        do {
          *pdVar5 = *pdVar5 - *pdVar3;
          pdVar3 = pdVar3 + lVar8;
          lVar6 = lVar6 + -1;
          pdVar5 = pdVar5 + local_88.m_rows;
        } while (lVar6 != 0);
      }
      if (local_88.m_cols !=
          (this->basic_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                     );
      }
      local_38 = &this->basic_matrix_;
      local_40 = (undefined1 *)&local_88;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_58,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)&local_40);
      uVar10 = (this->train_data_matrix_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      if ((long)uVar10 < 1) {
        lVar6 = 0;
LAB_001063a2:
        iVar1 = (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        free(local_58);
        free(local_88.m_data);
        free(local_70.m_data);
        return iVar1;
      }
      pdVar3 = (this->train_data_matrix_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar6 = (this->train_data_matrix_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      if (local_58 == (double *)0x0 || -1 < local_48) {
        if (local_50 < 1) goto LAB_00106415;
        if (pdVar3 == (double *)0x0 || -1 < lVar6) {
          if (local_48 != lVar6) {
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Rhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>]"
                         );
          }
          pdVar5 = pdVar3 + uVar10;
          uVar9 = 0;
          dVar11 = -1.0;
          uVar4 = 0;
          do {
            dVar12 = 0.0;
            if (lVar6 != 0) {
              if (lVar6 < 1) {
                __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                              ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                             );
              }
              dVar12 = (*local_58 - pdVar3[uVar9]) * (*local_58 - pdVar3[uVar9]);
              pdVar7 = pdVar5;
              lVar8 = lVar6 + -1;
              pdVar2 = local_58;
              if (lVar6 != 1) {
                do {
                  dVar13 = pdVar2[local_50] - *pdVar7;
                  dVar12 = dVar12 + dVar13 * dVar13;
                  lVar8 = lVar8 + -1;
                  pdVar7 = pdVar7 + uVar10;
                  pdVar2 = pdVar2 + local_50;
                } while (lVar8 != 0);
              }
            }
            if (dVar12 < dVar11 || dVar11 < 0.0) {
              uVar4 = uVar9 & 0xffffffff;
              dVar11 = dVar12;
            }
            uVar9 = uVar9 + 1;
            pdVar5 = pdVar5 + 1;
          } while (uVar9 != uVar10);
          lVar6 = (long)(int)uVar4;
          goto LAB_001063a2;
        }
      }
    }
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
               );
}

Assistant:

int NPca::detector(u_char* image_data)
{
    int size = n_config_->image_height_ * n_config_->image_width_;  
    MatrixXd detector_matrix = MatrixXd::Zero(1, size);

    for (int i = 0; i < size; i++)
        detector_matrix.coeffRef(0, i) = image_data[i];

    MatrixXd detector_zero_matrix = detector_matrix;

    detector_zero_matrix.row(0) -= train_mean_.row(0);

    MatrixXd detector_data_matrix = detector_zero_matrix * basic_matrix_;
    int match_index = 0;
    double min_difference = -1;
    for (int i = 0; i < train_data_matrix_.rows(); i++)
    {
        double difference = (detector_data_matrix.row(0) - train_data_matrix_.row(i)).squaredNorm();
        if (min_difference < 0 || min_difference > difference)
        {
            min_difference = difference;
            match_index = i;
        }
    }

    return train_label_[match_index];
}